

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

void __thiscall
icu_63::MaybeStackArray<char,_40>::MaybeStackArray
          (MaybeStackArray<char,_40> *this,MaybeStackArray<char,_40> *src)

{
  MaybeStackArray<char,_40> *src_local;
  MaybeStackArray<char,_40> *this_local;
  
  this->ptr = src->ptr;
  this->capacity = src->capacity;
  this->needToRelease = src->needToRelease;
  if (src->ptr == src->stackArray) {
    this->ptr = this->stackArray;
    memcpy(this->stackArray,src->stackArray,(long)src->capacity);
  }
  else {
    resetToStackArray(src);
  }
  return;
}

Assistant:

icu::MaybeStackArray<T, stackCapacity>::MaybeStackArray(
        MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT
        : ptr(src.ptr), capacity(src.capacity), needToRelease(src.needToRelease) {
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        src.resetToStackArray();  // take ownership away from src
    }
}